

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O2

string * __thiscall
front::word::Word::get_token_string_abi_cxx11_(string *__return_storage_ptr__,Word *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)(Token_strs_abi_cxx11_ + (long)(int)this->token_value * 0x20));
  return __return_storage_ptr__;
}

Assistant:

string Word::get_token_string() { return Token_strs[(int)token_value]; }